

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_mark.cpp
# Opt level: O0

Read<signed_char> __thiscall
Omega_h::mark_class_closures
          (Omega_h *this,Mesh *mesh,Int ent_dim,
          vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_> *class_pairs)

{
  int iVar1;
  bool bVar2;
  LO size_in;
  Int IVar3;
  void *extraout_RDX;
  Read<signed_char> RVar4;
  Read<signed_char> local_c8;
  Read<signed_char> local_b8;
  Read<signed_char> local_a8;
  undefined1 local_98 [8];
  Read<signed_char> class_dim_marks;
  undefined1 local_80 [8];
  vector<int,_std::allocator<int>_> dim_class_ids;
  Int class_dim;
  allocator local_51;
  string local_50 [39];
  undefined1 local_29;
  vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_> *local_28;
  vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_> *class_pairs_local;
  Mesh *pMStack_18;
  Int ent_dim_local;
  Mesh *mesh_local;
  Read<signed_char> *marks;
  
  local_29 = 0;
  local_28 = class_pairs;
  class_pairs_local._4_4_ = ent_dim;
  pMStack_18 = mesh;
  mesh_local = (Mesh *)this;
  size_in = Mesh::nents(mesh,ent_dim);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_50,"",&local_51);
  Read<signed_char>::Read((Read<signed_char> *)this,size_in,'\0',(string *)local_50);
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  for (dim_class_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage._0_4_ = class_pairs_local._4_4_;
      iVar1 = (int)dim_class_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage, IVar3 = Mesh::dim(pMStack_18),
      iVar1 <= IVar3;
      dim_class_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._0_4_ =
           (int)dim_class_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage + 1) {
    get_dim_class_ids((vector<int,_std::allocator<int>_> *)local_80,
                      (int)dim_class_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage,local_28);
    bVar2 = std::vector<int,_std::allocator<int>_>::empty
                      ((vector<int,_std::allocator<int>_> *)local_80);
    if (bVar2) {
      class_dim_marks.write_.shared_alloc_.direct_ptr._4_4_ = 4;
    }
    else {
      mark_class_closures((Omega_h *)local_98,pMStack_18,class_pairs_local._4_4_,
                          (int)dim_class_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage,
                          (vector<int,_std::allocator<int>_> *)local_80);
      Read<signed_char>::Read(&local_b8,(Read<signed_char> *)this);
      Read<signed_char>::Read(&local_c8,(Read<signed_char> *)local_98);
      lor_each((Omega_h *)&local_a8,&local_b8,&local_c8);
      Read<signed_char>::operator=((Read<signed_char> *)this,&local_a8);
      Read<signed_char>::~Read(&local_a8);
      Read<signed_char>::~Read(&local_c8);
      Read<signed_char>::~Read(&local_b8);
      Read<signed_char>::~Read((Read<signed_char> *)local_98);
      class_dim_marks.write_.shared_alloc_.direct_ptr._4_4_ = 0;
    }
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_80);
  }
  RVar4.write_.shared_alloc_.direct_ptr = extraout_RDX;
  RVar4.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Read<signed_char>)RVar4.write_.shared_alloc_;
}

Assistant:

Read<I8> mark_class_closures(
    Mesh* mesh, Int ent_dim, std::vector<ClassPair> const& class_pairs) {
  auto marks = Read<I8>(mesh->nents(ent_dim), I8(0));
  for (Int class_dim = ent_dim; class_dim <= mesh->dim(); ++class_dim) {
    auto dim_class_ids = get_dim_class_ids(class_dim, class_pairs);
    if (dim_class_ids.empty()) continue;
    auto class_dim_marks =
        mark_class_closures(mesh, ent_dim, class_dim, dim_class_ids);
    marks = lor_each(marks, class_dim_marks);
  }
  return marks;
}